

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

Test * DepfileParserTestIndentedRulesCRLF::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x60);
  DepfileParserTestIndentedRulesCRLF((DepfileParserTestIndentedRulesCRLF *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DepfileParserTest, IndentedRulesCRLF) {
  string err;
  EXPECT_TRUE(Parse(" foo: x\r\n"
                    " foo: y\r\n"
                    " foo: z\r\n", &err));
  ASSERT_EQ("foo", parser_.out_.AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}